

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connection.cpp
# Opt level: O3

bool __thiscall myutils::IpcConnection::do_connect(IpcConnection *this)

{
  size_type *psVar1;
  undefined4 *puVar2;
  string *psVar3;
  ConnectionSlot *pCVar4;
  int *piVar5;
  char *pcVar6;
  Connection_Callback *pCVar7;
  bool bVar8;
  bool bVar9;
  SOCKET sock;
  int iVar10;
  int iVar11;
  long lVar12;
  rep rVar13;
  undefined8 *puVar14;
  FileMapping *pFVar15;
  ConnectionSlotInfo *pCVar16;
  ssize_t sVar17;
  size_t sVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  thread *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  undefined8 uVar21;
  IpcConnection *pIVar22;
  string addr;
  uint64_t slot_pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ss;
  string local_b8;
  string local_98;
  IpcConnection **local_78;
  long local_70;
  IpcConnection *local_68 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  IpcConnection *local_38;
  
  iVar11 = (int)&local_b8;
  if (this->m_connected != false) {
    return true;
  }
  if ((this->m_addr)._M_string_length == 0) {
    return false;
  }
  lVar12 = std::chrono::_V2::system_clock::now();
  if (lVar12 - (this->m_last_connect_time).__d.__r < 200000000) {
    return false;
  }
  rVar13 = std::chrono::_V2::system_clock::now();
  (this->m_last_connect_time).__d.__r = rVar13;
  clear_data(this);
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"?","");
  psVar3 = &this->m_addr;
  lVar12 = std::__cxx11::string::find_first_of((char *)psVar3,(ulong)local_b8._M_dataplus._M_p,0);
  if (lVar12 == -1) {
LAB_001487f6:
    std::__cxx11::string::substr((ulong)&local_98,(ulong)psVar3);
    trim(&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_58,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  else {
    local_38 = this;
    do {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)psVar3);
      trim(&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_58,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      uVar20 = lVar12 + 1;
      lVar12 = std::__cxx11::string::find_first_of
                         ((char *)psVar3,(ulong)local_b8._M_dataplus._M_p,uVar20);
    } while (lVar12 != -1);
    this = local_38;
    if (uVar20 != 0xffffffffffffffff) goto LAB_001487f6;
  }
  paVar19 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar19) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"shm_tq_ipc_","");
  std::__cxx11::string::substr
            ((ulong)&local_78,
             (ulong)local_58.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  uVar21 = (IpcConnection *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar19) {
    uVar21 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar21 < (IpcConnection *)(local_70 + local_b8._M_string_length)) {
    pIVar22 = (IpcConnection *)0xf;
    if (local_78 != local_68) {
      pIVar22 = local_68[0];
    }
    if ((IpcConnection *)(local_70 + local_b8._M_string_length) <= pIVar22) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_78,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
      goto LAB_001488d6;
    }
  }
  puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78);
LAB_001488d6:
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  psVar1 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98.field_2._8_8_ = puVar14[3];
  }
  else {
    local_98.field_2._M_allocated_capacity = *psVar1;
    local_98._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_98._M_string_length = puVar14[1];
  *puVar14 = psVar1;
  puVar14[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar19) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  pFVar15 = (FileMapping *)operator_new(0x30);
  pFVar15->m_pMapAddress = (char *)0x0;
  pFVar15->m_filesize = 0;
  pFVar15->m_fd = -1;
  (pFVar15->m_id)._M_dataplus._M_p = (pointer)&(pFVar15->m_id).field_2;
  (pFVar15->m_id)._M_string_length = 0;
  (pFVar15->m_id).field_2._M_local_buf[0] = '\0';
  this->m_svr_shmem = pFVar15;
  bVar9 = FileMapping::open_shmem(pFVar15,&local_98,0x9c50,false);
  bVar8 = true;
  if (bVar9) {
    pCVar16 = (ConnectionSlotInfo *)this->m_svr_shmem->m_pMapAddress;
    this->m_slot_info = pCVar16;
    if (pCVar16->slot_size == 400) {
      if (this->m_socket != -1) {
        ::close(this->m_socket);
        pCVar16 = this->m_slot_info;
      }
      sock = connect_socket("127.0.0.1",pCVar16->svr_port);
      this->m_socket = sock;
      if ((sock != -1) && (bVar9 = check_connect(sock,2), bVar9)) {
        set_socket_nonblock(this->m_socket,false);
        lVar12 = random();
        this->m_my_id = (long)(int)lVar12;
        sVar17 = ::send(this->m_socket,&this->m_my_id,8,0);
        if ((int)sVar17 == 8) {
          local_78 = (IpcConnection **)0x0;
          sVar17 = recv(this->m_socket,&local_78,8,0);
          bVar8 = true;
          if ((((int)sVar17 == 8) &&
              (pCVar16 = this->m_slot_info, local_78 < (IpcConnection **)(ulong)pCVar16->slot_count)
              ) && (pCVar16->slots[(long)local_78].client_id.super___atomic_base<unsigned_long>._M_i
                    == this->m_my_id)) {
            this->m_slot = (ConnectionSlot *)&pCVar16->slots[(long)local_78].client_id;
            set_socket_nonblock(this->m_socket,true);
            pFVar15 = (FileMapping *)operator_new(0x30);
            pFVar15->m_pMapAddress = (char *)0x0;
            pFVar15->m_filesize = 0;
            pFVar15->m_fd = -1;
            (pFVar15->m_id)._M_dataplus._M_p = (pointer)&(pFVar15->m_id).field_2;
            (pFVar15->m_id)._M_string_length = 0;
            (pFVar15->m_id).field_2._M_local_buf[0] = '\0';
            this->m_my_shmem = pFVar15;
            pCVar4 = this->m_slot;
            pcVar6 = pCVar4->shmem_name;
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            sVar18 = strlen(pcVar6);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,pcVar6,pCVar4->shmem_name + sVar18);
            bVar9 = FileMapping::open_shmem(pFVar15,&local_b8,this->m_slot->shmem_size,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            if (bVar9) {
              iVar10 = SharedSemaphore::open(this->m_slot->sem_send,iVar11);
              this->m_sem_recv = (SharedSemaphore *)CONCAT44(extraout_var,iVar10);
              iVar11 = SharedSemaphore::open(this->m_slot->sem_recv,iVar11);
              this->m_sem_send = (SharedSemaphore *)CONCAT44(extraout_var_00,iVar11);
              if (((SharedSemaphore *)CONCAT44(extraout_var_00,iVar11) != (SharedSemaphore *)0x0) &&
                 (this->m_sem_recv != (SharedSemaphore *)0x0)) {
                piVar5 = (int *)this->m_my_shmem->m_pMapAddress;
                iVar11 = piVar5[3];
                this->m_send_queue = (ShmemQueue *)((long)piVar5 + (long)iVar11);
                iVar10 = piVar5[2];
                puVar2 = (undefined4 *)((long)piVar5 + (long)iVar11);
                LOCK();
                *puVar2 = 0;
                UNLOCK();
                puVar2[1] = iVar10 + -0x14;
                puVar2[2] = puVar2[1];
                puVar2[4] = 0;
                puVar2[3] = puVar2[4];
                memset(puVar2 + 5,0,(long)(iVar10 + -0x14));
                pcVar6 = this->m_my_shmem->m_pMapAddress;
                iVar11 = piVar5[1];
                this->m_recv_queue = (ShmemQueue *)(pcVar6 + iVar11);
                iVar10 = *piVar5;
                pcVar6 = pcVar6 + iVar11;
                LOCK();
                pcVar6[0] = '\0';
                pcVar6[1] = '\0';
                pcVar6[2] = '\0';
                pcVar6[3] = '\0';
                UNLOCK();
                *(int *)(pcVar6 + 4) = iVar10 + -0x14;
                *(undefined4 *)(pcVar6 + 8) = *(undefined4 *)(pcVar6 + 4);
                pcVar6[0x10] = '\0';
                pcVar6[0x11] = '\0';
                pcVar6[0x12] = '\0';
                pcVar6[0x13] = '\0';
                *(undefined4 *)(pcVar6 + 0xc) = *(undefined4 *)(pcVar6 + 0x10);
                memset(pcVar6 + 0x14,0,(long)(iVar10 + -0x14));
                set_conn_stat(this,true);
                this->m_should_exit = false;
                this_00 = (thread *)operator_new(8);
                local_b8._M_dataplus._M_p = (pointer)recv_run;
                local_b8._M_string_length = 0;
                local_b8.field_2._M_allocated_capacity = (size_type)this;
                std::thread::
                thread<std::_Bind<void(myutils::IpcConnection::*(myutils::IpcConnection*))()>,,void>
                          (this_00,(_Bind<void_(myutils::IpcConnection::*(myutils::IpcConnection_*))()>
                                    *)&local_b8);
                this->m_recv_thread = this_00;
                pCVar7 = this->m_callback;
                if (pCVar7 != (Connection_Callback *)0x0) {
                  (*pCVar7->_vptr_Connection_Callback[2])(pCVar7,1);
                }
                bVar8 = false;
              }
            }
          }
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if (bVar8) {
    clear_data(this);
    return false;
  }
  return true;
}

Assistant:

bool IpcConnection::do_connect() 
{
    if (m_connected) return true;

    if (m_addr.empty()) return false;

    if (system_clock::now() - m_last_connect_time < milliseconds(200))
        return false;

    m_last_connect_time = system_clock::now();

    clear_data();

    do {
        vector<string> ss;
        split(m_addr, "?", &ss);
        string addr = string("shm_tq_ipc_") + ss[0].substr(6);
        m_svr_shmem = new myutils::FileMapping();
        if (!m_svr_shmem) break;
        if (!m_svr_shmem->open_shmem(addr, sizeof(ConnectionSlotInfo), false))
            break;

        m_slot_info = (ConnectionSlotInfo*)m_svr_shmem->addr();
        if (m_slot_info->slot_size != sizeof(ConnectionSlot)) break;

        if (m_socket != INVALID_SOCKET)
            closesocket(m_socket);

        m_socket = connect_socket("127.0.0.1", m_slot_info->svr_port);
        if (m_socket == INVALID_SOCKET || !myutils::check_connect(m_socket, 2))
            break;

        set_socket_nonblock(m_socket, false);
        m_my_id = (uint64_t)myutils::random();
        int r = ::send(m_socket, (const char*)&m_my_id, sizeof(m_my_id), 0);
        if (r != sizeof(m_my_id))
            break;

        uint64_t slot_pos = 0;
        r = ::recv(m_socket, (char*)&slot_pos, sizeof(slot_pos), 0);
        if (r != sizeof(slot_pos))
            break;
	
        if (slot_pos >= m_slot_info->slot_count) break;

        auto slot = m_slot_info->slots + slot_pos;
        if (slot->client_id != m_my_id) break;

        m_slot = slot;
        set_socket_nonblock(m_socket, true);

        m_my_shmem = new myutils::FileMapping();
        if (!m_my_shmem->open_shmem(m_slot->shmem_name, m_slot->shmem_size, false))
            break;

        m_sem_recv = SharedSemaphore::open(m_slot->sem_send);
        m_sem_send = SharedSemaphore::open(m_slot->sem_recv);
        if (!m_sem_recv || !m_sem_send) break;

        ShmemHead* head = (ShmemHead*)m_my_shmem->addr();

        // different between client and server
        m_send_queue = (ShmemQueue*)(m_my_shmem->addr() + head->recv_offset);
        m_send_queue->init(head->recv_size);
        m_recv_queue = (ShmemQueue*)(m_my_shmem->addr() + head->send_offset);
        m_recv_queue->init(head->send_size);

        set_conn_stat(true);
        m_should_exit = false;
        m_recv_thread = new thread(bind(&IpcConnection::recv_run, this));

        if (m_callback)
            m_callback->on_conn_status(true);

        return true;

    } while (false);

    clear_data();

    return false;
}